

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O0

size_type __thiscall lf::mesh::hybrid2d::Mesh::Index(Mesh *this,Entity *e)

{
  RefElType RVar1;
  RefElType RVar2;
  int iVar3;
  uint __val;
  char *pcVar4;
  runtime_error *prVar5;
  pointer_____offset_0x10___ *ppuVar6;
  undefined1 auVar7 [12];
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  stringstream local_3b8 [8];
  stringstream ss_1;
  ostream local_3a8 [376];
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [380];
  RefEl local_24;
  RefEl local_23;
  RefEl local_22;
  RefEl local_21;
  Entity *local_20;
  Entity *e_local;
  Mesh *this_local;
  
  local_20 = e;
  e_local = (Entity *)this;
  iVar3 = (**e->_vptr_Entity)();
  if (iVar3 == 0) {
    iVar3 = (*local_20->_vptr_Entity[4])();
    local_21.type_ = (RefElType)iVar3;
    RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_21);
    local_22 = lf::base::RefEl::kTria();
    RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_22);
    if (RVar1 == RVar2) {
      ppuVar6 = &Entity::typeinfo;
      auVar7 = __dynamic_cast(local_20,&Entity::typeinfo,&Triangle::typeinfo,0);
      if (auVar7._0_8_ == (Triangle *)0x0) {
        __cxa_bad_cast();
      }
      pcVar4 = Triangle::index(auVar7._0_8_,(char *)ppuVar6,auVar7._8_4_);
      this_local._4_4_ = (size_type)pcVar4;
    }
    else {
      iVar3 = (*local_20->_vptr_Entity[4])();
      local_23.type_ = (RefElType)iVar3;
      RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_23);
      local_24 = lf::base::RefEl::kQuad();
      RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_24);
      if (RVar1 != RVar2) {
        std::__cxx11::stringstream::stringstream(local_1b0);
        std::operator<<(local_1a0,"Illegal cell type");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"false",&local_1e1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
                   ,&local_209);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_1e0,&local_208,0x5d,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator(&local_209);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::allocator<char>::~allocator(&local_1e1);
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"this code should not be reached");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ppuVar6 = &Entity::typeinfo;
      auVar7 = __dynamic_cast(local_20,&Entity::typeinfo,&Quadrilateral::typeinfo,0);
      if (auVar7._0_8_ == (Quadrilateral *)0x0) {
        __cxa_bad_cast();
      }
      pcVar4 = Quadrilateral::index(auVar7._0_8_,(char *)ppuVar6,auVar7._8_4_);
      this_local._4_4_ = (size_type)pcVar4;
    }
  }
  else if (iVar3 == 1) {
    ppuVar6 = &Entity::typeinfo;
    auVar7 = __dynamic_cast(local_20,&Entity::typeinfo,&Segment::typeinfo,0);
    if (auVar7._0_8_ == (Segment *)0x0) {
      __cxa_bad_cast();
    }
    pcVar4 = Segment::index(auVar7._0_8_,(char *)ppuVar6,auVar7._8_4_);
    this_local._4_4_ = (size_type)pcVar4;
  }
  else {
    if (iVar3 != 2) {
      std::__cxx11::stringstream::stringstream(local_3b8);
      __val = (**local_20->_vptr_Entity)();
      std::__cxx11::to_string(&local_3f8,__val);
      std::operator+(&local_3d8,"Something is horribyl wrong, this entity has codim = ",&local_3f8);
      std::operator<<(local_3a8,(string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_418,"false",&local_419);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh.cc"
                 ,&local_441);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_418,&local_440,0x66,&local_468);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"this code should not be reached");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppuVar6 = &Entity::typeinfo;
    auVar7 = __dynamic_cast(local_20,&Entity::typeinfo,&Point::typeinfo,0);
    if (auVar7._0_8_ == (Point *)0x0) {
      __cxa_bad_cast();
    }
    pcVar4 = Point::index(auVar7._0_8_,(char *)ppuVar6,auVar7._8_4_);
    this_local._4_4_ = (size_type)pcVar4;
  }
  return this_local._4_4_;
}

Assistant:

Mesh::size_type Mesh::Index(const Entity &e) const {
  switch (e.Codim()) {
    case 0: {
      if (e.RefEl() == lf::base::RefEl::kTria()) {
        return dynamic_cast<const Triangle &>(e).index();
      }
      if (e.RefEl() == lf::base::RefEl::kQuad()) {
        return dynamic_cast<const Quadrilateral &>(e).index();
      }
      LF_VERIFY_MSG(false, "Illegal cell type");
    }
    case 1:
      return dynamic_cast<const Segment &>(e).index();
    case 2:
      return dynamic_cast<const Point &>(e).index();
    default:
      LF_VERIFY_MSG(false,
                    "Something is horribyl wrong, this entity has codim = " +
                        std::to_string(e.Codim()));
  }
}